

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O2

DNA * __thiscall Population::mutation(DNA *__return_storage_ptr__,Population *this,DNA *dna)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  Room *pRVar3;
  Subject *pSVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  string *psVar7;
  double dVar8;
  
  for (p_Var6 = (dna->schedule).schedule._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(dna->schedule).schedule._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    for (p_Var5 = *(_Rb_tree_node_base **)(p_Var6 + 4);
        p_Var5 != (_Rb_tree_node_base *)&p_Var6[3]._M_left;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      p_Var1 = p_Var5[2]._M_parent;
      for (psVar7 = (string *)(*(long *)(p_Var5 + 2) + 0x90); (_Base_ptr)(psVar7 + -0x90) != p_Var1;
          psVar7 = psVar7 + 0xd8) {
        dVar8 = RandomProbability();
        if (dVar8 < this->mutationRate_) {
          pRVar3 = Schedule::GetRandomRoom(this->data_->rooms,*(size_t *)(p_Var6 + 3));
          sVar2 = pRVar3->capacity;
          *(undefined8 *)(psVar7 + -0x10) = *(undefined8 *)pRVar3;
          *(size_t *)(psVar7 + -8) = sVar2;
        }
        dVar8 = RandomProbability();
        if (dVar8 < this->mutationRate_) {
          GetRandom<Teacher>((vector<Teacher,_std::allocator<Teacher>_> *)(psVar7 + -0x28));
          std::__cxx11::string::_M_assign(psVar7);
        }
        dVar8 = RandomProbability();
        if (dVar8 < this->mutationRate_) {
          pSVar4 = GetRandom<Subject>((vector<Subject,_std::allocator<Subject>_> *)
                                      &p_Var6[2]._M_parent);
          Subject::operator=((Subject *)(psVar7 + -0x48),pSVar4);
          GetRandom<Teacher>((vector<Teacher,_std::allocator<Teacher>_> *)(psVar7 + -0x28));
          std::__cxx11::string::_M_assign(psVar7);
        }
      }
    }
  }
  DNA::DNA(__return_storage_ptr__,dna);
  return __return_storage_ptr__;
}

Assistant:

DNA Population::mutation(DNA dna) const {
    auto& schedule = dna.schedule.schedule;
    for (auto&[group, schedulePerGroup] : schedule) {
        for (auto&[day, listOfClasses] : schedulePerGroup) {
            for (Class& class_ : listOfClasses) {
                if (RandomProbability() < mutationRate_) {
                    class_.room = Schedule::GetRandomRoom(data_.rooms, group.size);
                }
                if (RandomProbability() < mutationRate_) {
                    class_.teacher = GetRandom(class_.subject.teachers);
                }
                if (RandomProbability() < mutationRate_) {
                    class_.subject = GetRandom(group.subjects);
                    class_.teacher = GetRandom(class_.subject.teachers);
                }
            }
        }
    }
    return dna;
}